

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConnectorFederateManager.cpp
# Opt level: O3

Translator * __thiscall
helics::ConnectorFederateManager::getTranslator(ConnectorFederateManager *this,int index)

{
  bool bVar1;
  pthread_rwlock_t *__rwlock;
  undefined1 *puVar2;
  
  bVar1 = (this->translators).enabled;
  if (bVar1 == true) {
    __rwlock = (pthread_rwlock_t *)&(this->translators).m_mutex;
    std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)&__rwlock->__data);
  }
  else {
    __rwlock = (pthread_rwlock_t *)0x0;
  }
  puVar2 = invalidTran;
  if ((-1 < index) && (index < (int)(this->translators).m_obj.dataStorage.csize)) {
    puVar2 = (undefined1 *)
             ((long)&((this->translators).m_obj.dataStorage.dataptr[(uint)index >> 5]->
                     super_Interface)._vptr_Interface + (ulong)((index & 0x1fU) * 0x50));
  }
  if (bVar1 != false) {
    pthread_rwlock_unlock(__rwlock);
  }
  return (Translator *)puVar2;
}

Assistant:

const Translator& ConnectorFederateManager::getTranslator(int index) const
{
    auto sharedTran = translators.lock_shared();
    if (isValidIndex(index, *sharedTran)) {
        return (*sharedTran)[index];
    }
    return invalidTran;
}